

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *data;
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  string *value;
  Type *value_00;
  uint8 *puVar4;
  uint uVar5;
  uint32 tag;
  
  this_00 = &this->file_to_generate_;
LAB_001a9bcb:
  do {
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (tag = (uint32)(char)*puVar4, -1 < (char)*puVar4)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar4 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar5 = tag >> 3;
    uVar2 = tag & 7;
    if (uVar5 != 0xf) {
      if (uVar5 == 2) {
        if (uVar2 == 2) goto LAB_001a9ca8;
      }
      else if ((uVar5 == 1) && (uVar2 == 2)) {
        while( true ) {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase);
          bVar1 = internal::WireFormatLite::ReadString(input,pTVar3);
          if (!bVar1) {
            return false;
          }
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                              -1);
          data = (pTVar3->_M_dataplus)._M_p;
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                              -1);
          internal::WireFormat::VerifyUTF8StringFallback(data,(int)pTVar3->_M_string_length,PARSE);
          puVar4 = input->buffer_;
          if (input->buffer_end_ <= puVar4) goto LAB_001a9bcb;
          if (*puVar4 != '\n') break;
          input->buffer_ = puVar4 + 1;
        }
        if (*puVar4 == '\x12') {
          input->buffer_ = puVar4 + 1;
LAB_001a9ca8:
          value = mutable_parameter_abi_cxx11_(this);
          bVar1 = internal::WireFormatLite::ReadString(input,value);
          if (!bVar1) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
                     PARSE);
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (*puVar4 == 'z')) goto LAB_001a9d33;
        }
        goto LAB_001a9bcb;
      }
LAB_001a9cf2:
      if (uVar2 == 4) {
        return true;
      }
      bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      if (!bVar1) {
        return false;
      }
      goto LAB_001a9bcb;
    }
    if (uVar2 != 2) goto LAB_001a9cf2;
    while( true ) {
      value_00 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                           (&(this->proto_file_).super_RepeatedPtrFieldBase);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FileDescriptorProto>
                        (input,value_00);
      if (!bVar1) {
        return false;
      }
      puVar4 = input->buffer_;
      if ((input->buffer_end_ <= puVar4) || (*puVar4 != 'z')) break;
LAB_001a9d33:
      input->buffer_ = puVar4 + 1;
    }
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file_to_generate:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file_to_generate;
        if (input->ExpectTag(18)) goto parse_parameter;
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_parameter:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_proto_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}